

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O0

void des3_set2key(uint32_t *esk,uint32_t *dsk,uchar *key)

{
  int local_24;
  int i;
  uchar *key_local;
  uint32_t *dsk_local;
  uint32_t *esk_local;
  
  mbedtls_des_setkey(esk,key);
  mbedtls_des_setkey(dsk + 0x20,key + 8);
  for (local_24 = 0; local_24 < 0x20; local_24 = local_24 + 2) {
    dsk[local_24] = esk[0x1e - local_24];
    dsk[local_24 + 1] = esk[0x1f - local_24];
    esk[local_24 + 0x20] = dsk[0x3e - local_24];
    esk[local_24 + 0x21] = dsk[0x3f - local_24];
    esk[local_24 + 0x40] = esk[local_24];
    esk[local_24 + 0x41] = esk[local_24 + 1];
    dsk[local_24 + 0x40] = dsk[local_24];
    dsk[local_24 + 0x41] = dsk[local_24 + 1];
  }
  return;
}

Assistant:

static void des3_set2key( uint32_t esk[96],
                          uint32_t dsk[96],
                          const unsigned char key[MBEDTLS_DES_KEY_SIZE*2] )
{
    int i;

    mbedtls_des_setkey( esk, key );
    mbedtls_des_setkey( dsk + 32, key + 8 );

    for( i = 0; i < 32; i += 2 )
    {
        dsk[i     ] = esk[30 - i];
        dsk[i +  1] = esk[31 - i];

        esk[i + 32] = dsk[62 - i];
        esk[i + 33] = dsk[63 - i];

        esk[i + 64] = esk[i    ];
        esk[i + 65] = esk[i + 1];

        dsk[i + 64] = dsk[i    ];
        dsk[i + 65] = dsk[i + 1];
    }
}